

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Status SVar4;
  tm *ptVar5;
  ulong uVar6;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var7;
  int iVar8;
  bool suppress;
  cmake *this_00;
  char cVar9;
  int iVar10;
  int mon;
  undefined4 uStack_1e24;
  string tag;
  int day;
  string testingDir;
  time_t tctime;
  int min;
  int hour;
  string tagfile;
  string group;
  byte abStack_1d70 [480];
  string model;
  int year;
  size_type local_1a10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a08 [6];
  ifstream tfin;
  byte abStack_1988 [496];
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  
  if (command == (cmCTestStartCommand *)0x0) {
    suppress = false;
  }
  else {
    suppress = command->Quiet;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
  poVar3 = std::operator<<((ostream *)&cm,"Here: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1a4);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x1a4,(char *)mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,suppress);
  std::__cxx11::string::~string((string *)&mf);
  this_00 = &cm;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->InteractiveDebugMode == false
     ) {
    BlockTestErrorDiagnostics((cmCTest *)this_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cm,"CTEST_INTERACTIVE_DEBUG_MODE=1",(allocator<char> *)&mf);
    cmsys::SystemTools::PutEnv((string *)&cm);
    std::__cxx11::string::~string((string *)&cm);
  }
  std::__cxx11::string::assign
            ((char *)&((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BinaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes
            (&((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BinaryDir);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
  poVar3 = std::operator<<((ostream *)&cm,"Here: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x1b0,(char *)mf.FindPackageRootPathStack.
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map,suppress);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
    poVar3 = std::operator<<((ostream *)&cm,"Here: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1b2);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1b2,(char *)mf.FindPackageRootPathStack.
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map,suppress);
    std::__cxx11::string::~string((string *)&mf);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
    poVar3 = std::operator<<((ostream *)&cm,"   Site: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gg,"Site",(allocator<char> *)&year);
    GetCTestConfiguration((string *)&mf,this,(string *)&gg);
    poVar3 = std::operator<<(poVar3,(string *)&mf);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"   Build name: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&model,"BuildName",(allocator<char> *)&testingDir);
    GetCTestConfiguration(&group,this,&model);
    SafeBuildIdField((string *)&tfin,&group);
    poVar3 = std::operator<<(poVar3,(string *)&tfin);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&tfin);
    std::__cxx11::string::~string((string *)&group);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::string::~string((string *)&mf);
    std::__cxx11::string::~string((string *)&gg);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1ba,(char *)mf.FindPackageRootPathStack.
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map,suppress);
    std::__cxx11::string::~string((string *)&mf);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
    poVar3 = std::operator<<((ostream *)&cm,"Produce XML is on");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1bb,(char *)mf.FindPackageRootPathStack.
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_map,suppress);
    std::__cxx11::string::~string((string *)&mf);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestModel == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mf,"NightlyStartTime",(allocator<char> *)&gg);
      GetCTestConfiguration((string *)&cm,this,(string *)&mf);
      std::__cxx11::string::~string((string *)&cm);
      std::__cxx11::string::~string((string *)&mf);
      if (cm.Generators.
          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
        poVar3 = std::operator<<((ostream *)&cm,
                                 "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x1c3,(char *)mf.FindPackageRootPathStack.
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_map,suppress);
        std::__cxx11::string::~string((string *)&mf);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cm);
        poVar3 = std::operator<<((ostream *)&cm,"Here: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1c4);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x1c5,(char *)mf.FindPackageRootPathStack.
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_map,suppress);
        std::__cxx11::string::~string((string *)&mf);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cm);
        return 0;
      }
    }
  }
  iVar10 = 1;
  cmake::cmake(&cm,RoleScript,CTest,Normal);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  _tfin = (pointer)cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)&tfin);
  ReadCustomConfigurationFileTree
            (this,&((this->Impl)._M_t.
                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->BinaryDir,&mf);
  _Var7._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((_Var7._M_head_impl)->ProduceXML != true) goto LAB_0015458f;
  std::operator+(&testingDir,&(_Var7._M_head_impl)->BinaryDir,"/Testing");
  bVar1 = cmsys::SystemTools::FileExists(&testingDir);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory(&testingDir);
    if (bVar1) goto LAB_00153af5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tfin);
    poVar3 = std::operator<<((ostream *)&tfin,"File ");
    poVar3 = std::operator<<(poVar3,(string *)&testingDir);
    poVar3 = std::operator<<(poVar3," is in the place of the testing directory");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x1e0,group._M_dataplus._M_p,false);
LAB_00153ad6:
    std::__cxx11::string::~string((string *)&group);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tfin);
  }
  else {
    SVar4 = cmsys::SystemTools::MakeDirectory(&testingDir,(mode_t *)0x0);
    if (SVar4.Kind_ != Success) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tfin);
      poVar3 = std::operator<<((ostream *)&tfin,"Cannot create directory ");
      poVar3 = std::operator<<(poVar3,(string *)&testingDir);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x1e6,group._M_dataplus._M_p,false);
      goto LAB_00153ad6;
    }
LAB_00153af5:
    if (command == (cmCTestStartCommand *)0x0) {
      cVar9 = '\x01';
    }
    else {
      cVar9 = command->CreateNewTag;
    }
    std::operator+(&tagfile,&testingDir,"/TAG");
    std::ifstream::ifstream(&tfin,tagfile._M_dataplus._M_p,_S_in);
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    tag._M_string_length = 0;
    tag.field_2._M_local_buf[0] = '\0';
    if (cVar9 != '\0') {
      tctime = time((time_t *)0x0);
      if (((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TomorrowTag == true) {
        tctime = tctime + 0x15180;
      }
      ptVar5 = gmtime(&tctime);
      if (((abStack_1988[*(long *)(_tfin + -0x18)] & 5) == 0) &&
         (bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&tfin,&tag,(bool *)0x0,0xffffffffffffffff), bVar1)) {
        _year = _year & 0xffffffff00000000;
        mon = 0;
        hour = 0;
        min = 0;
        __isoc99_sscanf(tag._M_dataplus._M_p,"%04d%02d%02d-%02d%02d",&year);
        if ((year != ptVar5->tm_year + 0x76c) ||
           ((mon != ptVar5->tm_mon + 1 || (ptVar5->tm_mday != 0)))) {
          tag._M_string_length = 0;
          *tag._M_dataplus._M_p = '\0';
        }
        group._M_dataplus._M_p = (pointer)&group.field_2;
        group._M_string_length = 0;
        group.field_2._M_local_buf[0] = '\0';
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&tfin,&group,(bool *)0x0,0xffffffffffffffff);
        if (((bVar1) && (command == (cmCTestStartCommand *)0x0)) &&
           (_Var7._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
           *(bool *)((long)(_Var7._M_head_impl)->Parts + 0x18) == false)) {
          std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->SpecificGroup);
        }
        model._M_dataplus._M_p = (pointer)&model.field_2;
        model._M_string_length = 0;
        model.field_2._M_local_buf[0] = '\0';
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&tfin,&model,(bool *)0x0,0xffffffffffffffff);
        if (((bVar1) && (command == (cmCTestStartCommand *)0x0)) &&
           (*(bool *)((long)((this->Impl)._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts
                     + 0x18) == false)) {
          iVar2 = GetTestModelFromString(&model);
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestModel = iVar2;
        }
        std::ifstream::close();
        std::__cxx11::string::~string((string *)&model);
        std::__cxx11::string::~string((string *)&group);
      }
      if (((command != (cmCTestStartCommand *)0x0) || (tag._M_string_length == 0)) ||
         (*(bool *)((long)((this->Impl)._M_t.
                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                           .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts +
                   0x18) == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
        poVar3 = std::operator<<((ostream *)&group,"TestModel: ");
        GetTestModelString_abi_cxx11_(&model,this);
        poVar3 = std::operator<<(poVar3,(string *)&model);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&model);
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x218,model._M_dataplus._M_p,suppress);
        std::__cxx11::string::~string((string *)&model);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
        poVar3 = std::operator<<((ostream *)&group,"TestModel: ");
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,((this->Impl)._M_t.
                                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)
                                   ->TestModel);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x21b,model._M_dataplus._M_p,suppress);
        std::__cxx11::string::~string((string *)&model);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        if (((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestModel == 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&model,"NightlyStartTime",(allocator<char> *)&year);
          GetCTestConfiguration(&group,this,&model);
          ptVar5 = (tm *)GetNightlyTime(this,&group,
                                        ((this->Impl)._M_t.
                                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                         .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                        _M_head_impl)->TomorrowTag);
          std::__cxx11::string::~string((string *)&group);
          std::__cxx11::string::~string((string *)&model);
        }
        snprintf((char *)&year,100,"%04d%02d%02d-%02d%02d",(ulong)(ptVar5->tm_year + 0x76c),
                 (ulong)(ptVar5->tm_mon + 1),(ulong)(uint)ptVar5->tm_mday,
                 (ulong)(uint)ptVar5->tm_hour,(ulong)(uint)ptVar5->tm_min);
        std::__cxx11::string::assign((char *)&tag);
        std::ofstream::ofstream(&group,tagfile._M_dataplus._M_p,_S_out);
        if ((abStack_1d70[*(long *)(group._M_dataplus._M_p + -0x18)] & 5) == 0) {
          poVar3 = std::operator<<((ostream *)&group,(string *)&tag);
          std::endl<char,std::char_traits<char>>(poVar3);
          GetTestModelString_abi_cxx11_(&model,this);
          poVar3 = std::operator<<((ostream *)&group,(string *)&model);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&model);
          uVar6 = (ulong)(uint)((this->Impl)._M_t.
                                super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                               TestModel;
          if (uVar6 < 3) {
            poVar3 = std::operator<<((ostream *)&group,
                                     &DAT_005fd668 + *(int *)(&DAT_005fd668 + uVar6 * 4));
            std::endl<char,std::char_traits<char>>(poVar3);
          }
        }
        std::ofstream::close();
        if (command == (cmCTestStartCommand *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&model);
          poVar3 = std::operator<<((ostream *)&model,"Create new tag: ");
          poVar3 = std::operator<<(poVar3,(string *)&tag);
          poVar3 = std::operator<<(poVar3," - ");
          GetTestModelString_abi_cxx11_((string *)&mon,this);
          poVar3 = std::operator<<(poVar3,(string *)&mon);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&mon);
          std::__cxx11::stringbuf::str();
          Log(this,1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x23c,(char *)CONCAT44(uStack_1e24,mon),suppress);
          std::__cxx11::string::~string((string *)&mon);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&model);
        }
        std::ofstream::~ofstream(&group);
      }
LAB_00154552:
      std::__cxx11::string::_M_assign
                ((string *)
                 &((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CurrentTag);
      std::__cxx11::string::~string((string *)&tag);
      std::ifstream::~ifstream(&tfin);
      std::__cxx11::string::~string((string *)&tagfile);
      std::__cxx11::string::~string((string *)&testingDir);
      goto LAB_0015458f;
    }
    model._M_dataplus._M_p = (pointer)&model.field_2;
    model._M_string_length = 0;
    model.field_2._M_local_buf[0] = '\0';
    _year = (pointer)local_1a08;
    local_1a10 = 0;
    local_1a08[0]._M_local_buf[0] = '\0';
    if ((abStack_1988[*(long *)(_tfin + -0x18)] & 5) == 0) {
      cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&tag,(bool *)0x0,0xffffffffffffffff);
      cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&model,(bool *)0x0,0xffffffffffffffff);
      bVar1 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&tfin,(string *)&year,(bool *)0x0,0xffffffffffffffff);
      if (bVar1) {
        iVar2 = GetTestModelFromString((string *)&year);
      }
      else {
        iVar2 = -1;
      }
      std::ifstream::close();
      if (tag._M_string_length == 0) goto LAB_001541f3;
      _Var7._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      iVar8 = (_Var7._M_head_impl)->TestModel;
      if ((_Var7._M_head_impl)->TestModel != -1) {
LAB_00154360:
        if (iVar2 != -1 && iVar2 != iVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
          poVar3 = std::operator<<((ostream *)&group,
                                   "Model given in TAG does not match model given in ctest_start()")
          ;
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x266,(char *)CONCAT44(uStack_1e24,mon),suppress);
          std::__cxx11::string::~string((string *)&mon);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
          _Var7._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        }
        if (((_Var7._M_head_impl)->SpecificGroup)._M_string_length == 0) {
LAB_00154479:
          std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->SpecificGroup);
        }
        else {
          bVar1 = std::operator!=(&model,&(_Var7._M_head_impl)->SpecificGroup);
          if (!bVar1) {
            _Var7._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            goto LAB_00154479;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
          poVar3 = std::operator<<((ostream *)&group,
                                   "Group given in TAG does not match group given in ctest_start()")
          ;
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x26f,(char *)CONCAT44(uStack_1e24,mon),suppress);
          std::__cxx11::string::~string((string *)&mon);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
        poVar3 = std::operator<<((ostream *)&group,"  Use existing tag: ");
        poVar3 = std::operator<<(poVar3,(string *)&tag);
        poVar3 = std::operator<<(poVar3," - ");
        GetTestModelString_abi_cxx11_((string *)&mon,this);
        poVar3 = std::operator<<(poVar3,(string *)&mon);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&mon);
        std::__cxx11::stringbuf::str();
        Log(this,1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x278,(char *)CONCAT44(uStack_1e24,mon),suppress);
        std::__cxx11::string::~string((string *)&mon);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
        std::__cxx11::string::~string((string *)&year);
        std::__cxx11::string::~string((string *)&model);
        goto LAB_00154552;
      }
      if (iVar2 != -1) {
        (_Var7._M_head_impl)->InteractiveDebugMode = false;
        (_Var7._M_head_impl)->TestModel = iVar2;
        iVar8 = iVar2;
        goto LAB_00154360;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
      poVar3 = std::operator<<((ostream *)&group,
                               "TAG file does not contain model and no model specified in start command"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x259,(char *)CONCAT44(uStack_1e24,mon),false);
    }
    else {
LAB_001541f3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&group);
      poVar3 = std::operator<<((ostream *)&group,"Cannot read existing TAG file in ");
      poVar3 = std::operator<<(poVar3,(string *)&testingDir);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x250,(char *)CONCAT44(uStack_1e24,mon),false);
    }
    std::__cxx11::string::~string((string *)&mon);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&group);
    std::__cxx11::string::~string((string *)&year);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::string::~string((string *)&tag);
    std::ifstream::~ifstream(&tfin);
    std::__cxx11::string::~string((string *)&tagfile);
  }
  std::__cxx11::string::~string((string *)&testingDir);
  iVar10 = 0;
LAB_0015458f:
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  return iVar10;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->Impl->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->Impl->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->Impl->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->Impl->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(this, OUTPUT,
                       "   Site: "
                         << this->GetCTestConfiguration("Site") << std::endl
                         << "   Build name: "
                         << cmCTest::SafeBuildIdField(
                              this->GetCTestConfiguration("BuildName"))
                         << std::endl,
                       quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->Impl->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!this->ReadCustomConfigurationFileTree(this->Impl->BinaryDir, &mf)) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->Impl->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->Impl->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir)) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "File " << testingDir
                           << " is in the place of the testing directory"
                           << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Cannot create directory " << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(nullptr);
      if (this->Impl->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag.clear();
        }
        std::string group;
        if (cmSystemTools::GetLineFromStream(tfin, group) &&
            !this->Impl->Parts[PartStart] && !command) {
          this->Impl->SpecificGroup = group;
        }
        std::string model;
        if (cmSystemTools::GetLineFromStream(tfin, model) &&
            !this->Impl->Parts[PartStart] && !command) {
          this->Impl->TestModel = GetTestModelFromString(model);
        }
        tfin.close();
      }
      if (tag.empty() || (nullptr != command) ||
          this->Impl->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(this, DEBUG,
                           "TestModel: " << this->Impl->TestModel << std::endl,
                           quiet);
        if (this->Impl->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->Impl->TomorrowTag);
        }
        char datestring[100];
        snprintf(datestring, sizeof(datestring), "%04d%02d%02d-%02d%02d",
                 lctime->tm_year + 1900, lctime->tm_mon + 1, lctime->tm_mday,
                 lctime->tm_hour, lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
          switch (this->Impl->TestModel) {
            case cmCTest::EXPERIMENTAL:
              ofs << "Experimental" << std::endl;
              break;
            case cmCTest::NIGHTLY:
              ofs << "Nightly" << std::endl;
              break;
            case cmCTest::CONTINUOUS:
              ofs << "Continuous" << std::endl;
              break;
          }
        }
        ofs.close();
        if (nullptr == command) {
          cmCTestOptionalLog(this, OUTPUT,
                             "Create new tag: " << tag << " - "
                                                << this->GetTestModelString()
                                                << std::endl,
                             quiet);
        }
      }
    } else {
      std::string group;
      std::string modelStr;
      int model = cmCTest::UNKNOWN;

      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        cmSystemTools::GetLineFromStream(tfin, group);
        if (cmSystemTools::GetLineFromStream(tfin, modelStr)) {
          model = GetTestModelFromString(modelStr);
        }
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Cannot read existing TAG file in " << testingDir
                                                       << std::endl);
        return 0;
      }

      if (this->Impl->TestModel == cmCTest::UNKNOWN) {
        if (model == cmCTest::UNKNOWN) {
          cmCTestLog(this, ERROR_MESSAGE,
                     "TAG file does not contain model and "
                     "no model specified in start command"
                       << std::endl);
          return 0;
        }

        this->SetTestModel(model);
      }

      if (model != this->Impl->TestModel && model != cmCTest::UNKNOWN &&
          this->Impl->TestModel != cmCTest::UNKNOWN) {
        cmCTestOptionalLog(this, WARNING,
                           "Model given in TAG does not match "
                           "model given in ctest_start()"
                             << std::endl,
                           quiet);
      }

      if (!this->Impl->SpecificGroup.empty() &&
          group != this->Impl->SpecificGroup) {
        cmCTestOptionalLog(this, WARNING,
                           "Group given in TAG does not match "
                           "group given in ctest_start()"
                             << std::endl,
                           quiet);
      } else {
        this->Impl->SpecificGroup = group;
      }

      cmCTestOptionalLog(this, OUTPUT,
                         "  Use existing tag: " << tag << " - "
                                                << this->GetTestModelString()
                                                << std::endl,
                         quiet);
    }

    this->Impl->CurrentTag = tag;
  }

  return 1;
}